

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  secp256k1_scratch_space *b;
  secp256k1_scalar *a;
  secp256k1_ge *r;
  bench_data *data_00;
  secp256k1_gej *a_00;
  void *__ptr;
  secp256k1_gej *__ptr_00;
  bench_data *in_RSI;
  int in_EDI;
  secp256k1_scalar *in_stack_00000008;
  int iters;
  size_t scratch_size;
  int p;
  int i;
  bench_data data;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int local_7c;
  secp256k1_context *local_78;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = get_iters(in_stack_ffffffffffffff70);
  if (1 < in_EDI) {
    iVar2 = have_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
    if (((iVar2 != 0) ||
        (iVar2 = have_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70)), iVar2 != 0)) ||
       (iVar2 = have_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70)), iVar2 != 0)) {
      help((char **)0x10e086);
      return 0;
    }
    iVar2 = have_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
    if (iVar2 == 0) {
      iVar2 = have_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
      if (iVar2 == 0) {
        iVar2 = have_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
        if (iVar2 == 0) {
          fprintf(_stderr,"%s: unrecognized argument \'%s\'.\n\n",in_RSI->ctx,in_RSI->scratch);
          help((char **)0x10e17d);
          return 1;
        }
        printf("Using simple algorithm:\n");
      }
      else {
        printf("Using strauss_wnaf:\n");
      }
    }
    else {
      printf("Using pippenger_wnaf:\n");
    }
  }
  local_78 = secp256k1_context_create((uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  sVar3 = secp256k1_strauss_scratch_size(0x8000);
  iVar2 = have_flag(in_stack_ffffffffffffff80,(char **)(sVar3 + 0x50),
                    (char *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
  if (iVar2 == 0) {
    b = secp256k1_scratch_space_create
                  ((secp256k1_context *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    b = (secp256k1_scratch_space *)0x0;
  }
  a = (secp256k1_scalar *)malloc(0x100000);
  r = (secp256k1_ge *)malloc(0x100000);
  data_00 = (bench_data *)malloc(0x2c0000);
  a_00 = (secp256k1_gej *)malloc(0x400000);
  __ptr = malloc((long)(iVar1 + 1) << 7);
  __ptr_00 = (secp256k1_gej *)malloc((long)(iVar1 + 1) << 7);
  secp256k1_gej_set_ge
            ((secp256k1_gej *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
             (secp256k1_ge *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  for (local_7c = 0; local_7c < 0x8000; local_7c = local_7c + 1) {
    generate_scalar(scratch_size._4_4_,in_stack_00000008);
    if (local_7c != 0) {
      secp256k1_gej_double_var
                ((secp256k1_gej *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                 (secp256k1_gej *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (secp256k1_fe *)0x10e2eb);
      secp256k1_scalar_add((secp256k1_scalar *)data_00,a,(secp256k1_scalar *)b);
    }
  }
  secp256k1_ge_set_all_gej_var(r,a_00,(size_t)data_00);
  print_output_table_header_row();
  hash_into_offset((bench_data *)&local_78,0);
  run_ecmult_bench(data_00,(int)((ulong)a >> 0x20));
  for (local_7c = 1; local_7c < 9; local_7c = local_7c + 1) {
    run_ecmult_multi_bench
              (in_RSI,(size_t)__ptr_00,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  }
  if (2 < iVar1) {
    for (iVar2 = 0; iVar2 < 0xc; iVar2 = iVar2 + 1) {
      for (local_7c = 9; local_7c < 0x11; local_7c = local_7c + 1) {
        run_ecmult_multi_bench
                  (in_RSI,(size_t)__ptr_00,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
      }
    }
  }
  if (b != (secp256k1_scratch_space *)0x0) {
    secp256k1_scratch_space_destroy
              ((secp256k1_context *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
               (secp256k1_scratch_space *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  secp256k1_context_destroy((secp256k1_context *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
  free(a);
  free(data_00);
  free(a_00);
  free(r);
  free(__ptr_00);
  free(__ptr);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    bench_data data;
    int i, p;
    size_t scratch_size;

    int iters = get_iters(10000);

    data.ecmult_multi = secp256k1_ecmult_multi_var;

    if (argc > 1) {
        if(have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(argv);
            return EXIT_SUCCESS;
        } else if(have_flag(argc, argv, "pippenger_wnaf")) {
            printf("Using pippenger_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
        } else if(have_flag(argc, argv, "strauss_wnaf")) {
            printf("Using strauss_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
        } else if(have_flag(argc, argv, "simple")) {
            printf("Using simple algorithm:\n");
        } else {
            fprintf(stderr, "%s: unrecognized argument '%s'.\n\n", argv[0], argv[1]);
            help(argv);
            return EXIT_FAILURE;
        }
    }

    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    scratch_size = secp256k1_strauss_scratch_size(POINTS) + STRAUSS_SCRATCH_OBJECTS*16;
    if (!have_flag(argc, argv, "simple")) {
        data.scratch = secp256k1_scratch_space_create(data.ctx, scratch_size);
    } else {
        data.scratch = NULL;
    }

    /* Allocate stuff */
    data.scalars = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.seckeys = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.pubkeys = malloc(sizeof(secp256k1_ge) * POINTS);
    data.pubkeys_gej = malloc(sizeof(secp256k1_gej) * POINTS);
    data.expected_output = malloc(sizeof(secp256k1_gej) * (iters + 1));
    data.output = malloc(sizeof(secp256k1_gej) * (iters + 1));

    /* Generate a set of scalars, and private/public keypairs. */
    secp256k1_gej_set_ge(&data.pubkeys_gej[0], &secp256k1_ge_const_g);
    secp256k1_scalar_set_int(&data.seckeys[0], 1);
    for (i = 0; i < POINTS; ++i) {
        generate_scalar(i, &data.scalars[i]);
        if (i) {
            secp256k1_gej_double_var(&data.pubkeys_gej[i], &data.pubkeys_gej[i - 1], NULL);
            secp256k1_scalar_add(&data.seckeys[i], &data.seckeys[i - 1], &data.seckeys[i - 1]);
        }
    }
    secp256k1_ge_set_all_gej_var(data.pubkeys, data.pubkeys_gej, POINTS);


    print_output_table_header_row();
    /* Initialize offset1 and offset2 */
    hash_into_offset(&data, 0);
    run_ecmult_bench(&data, iters);

    for (i = 1; i <= 8; ++i) {
        run_ecmult_multi_bench(&data, i, 1, iters);
    }

    /* This is disabled with low count of iterations because the loop runs 77 times even with iters=1
    * and the higher it goes the longer the computation takes(more points)
    * So we don't run this benchmark with low iterations to prevent slow down */
     if (iters > 2) {
        for (p = 0; p <= 11; ++p) {
            for (i = 9; i <= 16; ++i) {
                run_ecmult_multi_bench(&data, i << p, 1, iters);
            }
        }
    }

    if (data.scratch != NULL) {
        secp256k1_scratch_space_destroy(data.ctx, data.scratch);
    }
    secp256k1_context_destroy(data.ctx);
    free(data.scalars);
    free(data.pubkeys);
    free(data.pubkeys_gej);
    free(data.seckeys);
    free(data.output);
    free(data.expected_output);

    return EXIT_SUCCESS;
}